

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall coins_tests::coins_resource_is_used::test_method(coins_resource_is_used *this)

{
  long lVar1;
  size_t i;
  long lVar2;
  allocator_type *__a;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  check_type cVar5;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 local_218 [16];
  shared_count local_208;
  char **local_200;
  assertion_result local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  size_t usage_before;
  char *local_1b8;
  char *local_1b0;
  binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  local_1a8;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  CCoinsMap map;
  COutPoint out_point;
  CCoinsMapMemoryResource resource;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<144UL,_8UL>::PoolResource(&resource);
  PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(&resource);
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&out_point,false);
  __a = (allocator_type *)local_218;
  local_218._0_8_ = &resource;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&map._M_h,0,(SaltedOutpointHasher *)&out_point,(key_equal *)&local_1f8,__a);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  file.m_end = (iterator)0x456;
  file.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  local_1f8._0_8_ =
       memusage::
       DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                 (&map);
  local_1f8.m_message.px = (element_type *)resource.m_chunk_size_bytes;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate((assertion_result *)local_218,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
              *)&local_1f8,false);
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_1a8;
  local_1a8.m_lhs.m_value = (unsigned_long *)0xb6913a;
  local_1a8.m_rhs = 0xb69172;
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
       out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_0113a070
  ;
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1b0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_218,(lazy_ostream *)&out_point,1,0xe,WARN,_cVar5,
             (size_t)&local_1b8,0x456);
  boost::detail::shared_count::~shared_count(&local_208);
  std::__detail::
  _Rehash_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&map,1000);
  usage_before = memusage::
                 DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                           ((unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                             *)&map);
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  out_point.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  out_point.n = 0xffffffff;
  for (lVar2 = 0; lVar2 != 1000; lVar2 = lVar2 + 1) {
    out_point.n = (uint32_t)lVar2;
    std::__detail::
    _Map_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&map,&out_point);
  }
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x462;
  file_00.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  local_1a8.m_rhs =
       memusage::
       DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                 (&map);
  local_1a8.m_lhs.m_value = &usage_before;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<const_unsigned_long_&>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_1f8,&local_1a8,false);
  local_200 = &local_228;
  local_228 = "usage_before == memusage::DynamicUsage(map)";
  local_220 = "";
  local_218[8] = false;
  local_218._0_8_ = &PTR__lazy_ostream_0113a070;
  local_208.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
  ;
  local_230 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1f8,(lazy_ostream *)local_218,1,0xe,WARN,_cVar5,(size_t)&local_238,0x462);
  boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&map._M_h);
  PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(&resource);
  PoolResource<144UL,_8UL>::~PoolResource(&resource);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(coins_resource_is_used)
{
    CCoinsMapMemoryResource resource;
    PoolResourceTester::CheckAllDataAccountedFor(resource);

    {
        CCoinsMap map{0, CCoinsMap::hasher{}, CCoinsMap::key_equal{}, &resource};
        BOOST_TEST(memusage::DynamicUsage(map) >= resource.ChunkSizeBytes());

        map.reserve(1000);

        // The resource has preallocated a chunk, so we should have space for at several nodes without the need to allocate anything else.
        const auto usage_before = memusage::DynamicUsage(map);

        COutPoint out_point{};
        for (size_t i = 0; i < 1000; ++i) {
            out_point.n = i;
            map[out_point];
        }
        BOOST_TEST(usage_before == memusage::DynamicUsage(map));
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}